

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O0

void writeRgbaWithPreview1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int width,int height)

{
  int iVar1;
  PreviewRgba *pPVar2;
  Array2D<Imf_3_2::PreviewRgba> *this;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Array2D<Imf_3_2::Rgba> *in_RSI;
  char *in_RDI;
  RgbaOutputFile file;
  Header header;
  int previewHeight;
  int previewWidth;
  Array2D<Imf_3_2::PreviewRgba> previewPixels;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Array2D<Imf_3_2::PreviewRgba> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff40;
  Vec2<float> *this_00;
  Rgba local_b0 [3];
  PreviewImage local_98 [16];
  Vec2<float> local_88;
  PreviewImage local_80 [72];
  uint local_38;
  uint local_34;
  Array2D<Imf_3_2::PreviewRgba> local_30;
  undefined4 local_18;
  undefined4 local_14;
  Array2D<Imf_3_2::Rgba> *local_10;
  char *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::Array2D(&local_30);
  makePreviewImage(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,
                   (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  this_00 = &local_88;
  Imath_3_2::Vec2<float>::Vec2(this_00,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_80,local_14,local_18,this_00,0,3);
  pPVar2 = Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::operator[](&local_30,0);
  Imf_3_2::PreviewImage::PreviewImage(local_98,local_34,local_38,pPVar2);
  Imf_3_2::Header::setPreviewImage(local_80);
  Imf_3_2::PreviewImage::~PreviewImage(local_98);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_b0,local_8,(Header *)local_80,WRITE_RGBA,iVar1);
  this = (Array2D<Imf_3_2::PreviewRgba> *)Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_10,0);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_b0,(ulong)this,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)local_b0);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_b0);
  Imf_3_2::Header::~Header((Header *)local_80);
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::~Array2D(this);
  return;
}

Assistant:

void
writeRgbaWithPreview1 (
    const char fileName[], const Array2D<Rgba>& pixels, int width, int height)
{
    //
    // Write an image file with a preview image, version 1:
    //
    // - generate the preview image by subsampling the main image
    // - generate a file header
    // - add the preview image to the file header
    // - open the file (this stores the header with the
    //   preview image in the file)
    // - describe the memory layout of the main image's pixels
    // - store the main image's pixels in the file
    //

    Array2D<PreviewRgba> previewPixels;
    int                  previewWidth;
    int                  previewHeight;

    makePreviewImage (
        pixels, width, height, previewPixels, previewWidth, previewHeight);

    Header header (width, height);

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (&pixels[0][0], 1, width);
    file.writePixels (height);
}